

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabBar *tab_bar_00;
  ImGuiDockNode *pIVar1;
  ImU32 IVar2;
  ImGuiTabItem *pIVar3;
  ImGuiWindow *docked_window;
  bool bVar4;
  ImGuiID tab_id_1;
  ImGuiDockNode *node;
  ImGuiWindow *window;
  ImGuiTabItem *tab;
  ImGuiID tab_id;
  ImGuiTabBar *tab_bar;
  bool is_within_manual_tab_bar;
  ImGuiContext *g;
  char *label_local;
  
  bVar4 = false;
  if (GImGui->CurrentTabBar != (ImGuiTabBar *)0x0) {
    bVar4 = (GImGui->CurrentTabBar->Flags & 0x100000U) == 0;
  }
  if (bVar4) {
    tab_bar_00 = GImGui->CurrentTabBar;
    IVar2 = TabBarCalcTabID(tab_bar_00,label,(ImGuiWindow *)0x0);
    pIVar3 = TabBarFindTabByID(tab_bar_00,IVar2);
    if (pIVar3 != (ImGuiTabItem *)0x0) {
      pIVar3->WantClose = true;
    }
  }
  else {
    docked_window = (ImGuiWindow *)FindWindowByName(label);
    if (((docked_window != (ImGuiWindow *)0x0) && ((docked_window->field_0x3e1 & 1) != 0)) &&
       (pIVar1 = docked_window->DockNode, pIVar1 != (ImGuiDockNode *)0x0)) {
      IVar2 = TabBarCalcTabID(pIVar1->TabBar,label,docked_window);
      TabBarRemoveTab(pIVar1->TabBar,IVar2);
      docked_window->field_0x3e1 = docked_window->field_0x3e1 & 0xf7 | 8;
    }
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label, NULL);
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
            tab->WantClose = true; // Will be processed by next call to TabBarLayout()
    }
    else if (ImGuiWindow* window = FindWindowByName(label))
    {
        if (window->DockIsActive)
            if (ImGuiDockNode* node = window->DockNode)
            {
                ImGuiID tab_id = TabBarCalcTabID(node->TabBar, label, window);
                TabBarRemoveTab(node->TabBar, tab_id);
                window->DockTabWantClose = true;
            }
    }
}